

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskAppendableFile::cloneFsNode(DiskAppendableFile *this)

{
  DiskHandle DVar1;
  _func_int **pp_Var2;
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode,_std::nullptr_t> OVar3;
  DiskHandle local_c;
  
  DiskHandle::clone(&local_c,(__fn *)(in_RSI + 0x10),in_RDX,in_ECX,in_R8);
  pp_Var2 = (_func_int **)operator_new(0x28);
  DVar1.fd.fd = local_c.fd.fd;
  ((OwnFd *)(pp_Var2 + 2))->fd = (int)local_c.fd.fd;
  local_c.fd.fd = (OwnFd)-1;
  ((OwnFd *)(pp_Var2 + 4))->fd = (int)DVar1.fd.fd;
  *(undefined4 *)((long)pp_Var2 + 0x24) = 0xffffffff;
  *pp_Var2 = (_func_int *)&PTR_getFd_00281520;
  pp_Var2[1] = (_func_int *)&DAT_00281580;
  pp_Var2[3] = (_func_int *)&DAT_002815b0;
  (this->super_AppendableFile).super_FsNode._vptr_FsNode =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance;
  (this->super_AppendableFile).super_OutputStream._vptr_OutputStream = pp_Var2;
  OwnFd::~OwnFd(&local_c.fd);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

void write(ArrayPtr<const byte> buffer) override {
    FdOutputStream::write(buffer);
  }